

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FilterInfo.cpp
# Opt level: O2

string * __thiscall helics::FilterInfo::getDestinationEndpoints_abi_cxx11_(FilterInfo *this)

{
  string *this_00;
  pointer pEVar1;
  pointer pEVar2;
  string local_50;
  
  this_00 = &this->destEpts;
  if ((this->destEpts)._M_string_length == 0) {
    pEVar2 = (this->destEndpoints).
             super__Vector_base<helics::EptInformation,_std::allocator<helics::EptInformation>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pEVar1 = (this->destEndpoints).
             super__Vector_base<helics::EptInformation,_std::allocator<helics::EptInformation>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    if (pEVar2 != pEVar1) {
      if ((long)pEVar1 - (long)pEVar2 == 0x48) {
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        _M_assign((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pEVar2->key)
        ;
      }
      else {
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        push_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,'[');
        pEVar1 = (this->destEndpoints).
                 super__Vector_base<helics::EptInformation,_std::allocator<helics::EptInformation>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        for (pEVar2 = (this->destEndpoints).
                      super__Vector_base<helics::EptInformation,_std::allocator<helics::EptInformation>_>
                      ._M_impl.super__Vector_impl_data._M_start; pEVar2 != pEVar1;
            pEVar2 = pEVar2 + 1) {
          generateJsonQuotedString(&local_50,&pEVar2->key);
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_50);
          std::__cxx11::string::~string((string *)&local_50);
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          push_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,','
                   );
        }
        (this->destEpts)._M_dataplus._M_p[(this->destEpts)._M_string_length - 1] = ']';
      }
    }
  }
  return this_00;
}

Assistant:

const std::string& FilterInfo::getDestinationEndpoints() const
{
    if (destEpts.empty()) {
        if (!destEndpoints.empty()) {
            if (destEndpoints.size() == 1) {
                destEpts = destEndpoints.front().key;
            } else {
                destEpts.push_back('[');
                for (const auto& trgt : destEndpoints) {
                    destEpts.append(generateJsonQuotedString(trgt.key));
                    destEpts.push_back(',');
                }
                destEpts.back() = ']';
            }
        }
    }
    return destEpts;
}